

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_>
getMessageUniquePtr(HelicsMessage message,HelicsError *err)

{
  short sVar1;
  HelicsError *pHVar2;
  int *in_RDX;
  
  if ((in_RDX == (int *)0x0) || (*in_RDX == 0)) {
    if (err == (HelicsError *)0x0) {
      if (in_RDX == (int *)0x0) goto LAB_001ae8c4;
    }
    else {
      sVar1 = *(short *)((long)&err->message + 2);
      pHVar2 = (HelicsError *)0x0;
      if (sVar1 == 0xb3) {
        pHVar2 = err;
      }
      if (sVar1 == 0xb3 || in_RDX == (int *)0x0) goto LAB_001ae8c6;
    }
    *in_RDX = -4;
    *(char **)(in_RDX + 2) = "The message object was not valid";
  }
LAB_001ae8c4:
  pHVar2 = (HelicsError *)0x0;
LAB_001ae8c6:
  if (pHVar2 != (HelicsError *)0x0) {
    if (pHVar2[0xf].message != (char *)0x0) {
      helics::MessageHolder::extractMessage((MessageHolder *)message,(int)pHVar2[0xf].message);
      if (in_RDX == (int *)0x0) {
        return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               message;
      }
      if (*message != 0) {
        return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               message;
      }
      *in_RDX = -4;
      *(char **)(in_RDX + 2) = "the message is NULL";
      return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             message;
    }
    if (in_RDX != (int *)0x0) {
      *in_RDX = -4;
      *(char **)(in_RDX + 2) = "the message is NULL";
    }
  }
  *(undefined8 *)message = 0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)message
  ;
}

Assistant:

std::unique_ptr<helics::Message> getMessageUniquePtr(HelicsMessage message, HelicsError* err)
{
    static constexpr char invalidLocationString[] = "the message is NULL";
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return nullptr;
    }
    auto* messages = reinterpret_cast<helics::MessageHolder*>(mess->backReference);
    if (messages != nullptr) {
        auto ptr = messages->extractMessage(mess->counter);
        if (!ptr) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidLocationString);
        }
        return ptr;
    }
    assignError(err, HELICS_ERROR_INVALID_ARGUMENT, emptyMessageErrorString);
    return nullptr;
}